

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_serialize.c
# Opt level: O0

char * serialize_ru124_(char *r,char *w,uint32_t *pv)

{
  uint32_t local_34;
  uint32_t v;
  uint32_t *pv_local;
  char *w_local;
  char *r_local;
  
  if (*pv == 0xff) {
    if (w < r + 4) {
      return (char *)0x0;
    }
    local_34 = *(uint32_t *)r;
    w_local = r + 4;
  }
  else {
    if (w <= r) {
      return (char *)0x0;
    }
    local_34 = (*pv & 0x1f) * 0x100 + (uint)(byte)*r + 0xe0;
    w_local = r + 1;
  }
  *pv = local_34;
  return w_local;
}

Assistant:

static LJ_NOINLINE char *serialize_ru124_(char *r, char *w, uint32_t *pv)
{
  uint32_t v = *pv;
  if (v != 0xff) {
    if (r >= w) return NULL;
    v = ((v & 0x1f) << 8) + *(uint8_t *)r + 0xe0; r++;
  } else {
    if (r + 4 > w) return NULL;
    v = lj_getu32(r); r += 4;
#if LJ_BE
    v = lj_bswap(v);
#endif
  }
  *pv = v;
  return r;
}